

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O0

size_t HTS_fread_big_endian(void *buf,size_t size,size_t n,HTS_File *fp)

{
  size_t block_00;
  HTS_File *in_RSI;
  void *in_RDI;
  size_t block;
  
  block_00 = HTS_fread(fp,block,(size_t)in_RDI,in_RSI);
  HTS_byte_swap(in_RDI,(size_t)in_RSI,block_00);
  return block_00;
}

Assistant:

size_t HTS_fread_big_endian(void *buf, size_t size, size_t n, HTS_File * fp)
{
   size_t block = HTS_fread(buf, size, n, fp);

#ifdef WORDS_LITTLEENDIAN
   HTS_byte_swap(buf, size, block);
#endif                          /* WORDS_LITTLEENDIAN */

   return block;
}